

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestate.c
# Opt level: O1

void transfer_state(_Bool load,char *path,em8051 *emu)

{
  uint uVar1;
  undefined7 in_register_00000039;
  uint32_t cpu [9];
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  
  transfer_data(load,path,"flash.bin",flash,0x20000);
  transfer_data(load,path,"intmem.bin",emu->mLowerData,0x100);
  transfer_data(load,path,"extmem.bin",emu->mExtData,0x10000);
  transfer_data(load,path,"ram.bin",ram,0x80000);
  transfer_data(load,path,"sfr.bin",emu->mSFR,0x80);
  uVar1 = emu->mPC;
  local_48 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->mTickDelay;
  local_44 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->mInterruptActive;
  local_40 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->int_a[0];
  local_3c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->int_a[1];
  local_38 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->int_psw[0];
  local_34 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->int_psw[1];
  local_30 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->int_sp[0];
  local_2c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = emu->int_sp[1];
  local_28 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  transfer_data(load,path,"cpu.bin",(uint8_t *)&local_48,0x24);
  if ((int)CONCAT71(in_register_00000039,load) != 0) {
    emu->mPC = local_48 >> 0x18 | (local_48 & 0xff0000) >> 8 | (local_48 & 0xff00) << 8 |
               local_48 << 0x18;
    emu->mTickDelay =
         local_44 >> 0x18 | (local_44 & 0xff0000) >> 8 | (local_44 & 0xff00) << 8 | local_44 << 0x18
    ;
    emu->mInterruptActive =
         local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 | local_40 << 0x18
    ;
    emu->int_a[0] =
         local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 | local_3c << 0x18
    ;
    emu->int_a[1] =
         local_38 >> 0x18 | (local_38 & 0xff0000) >> 8 | (local_38 & 0xff00) << 8 | local_38 << 0x18
    ;
    emu->int_psw[0] =
         local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 | local_34 << 0x18
    ;
    emu->int_psw[1] =
         local_30 >> 0x18 | (local_30 & 0xff0000) >> 8 | (local_30 & 0xff00) << 8 | local_30 << 0x18
    ;
    emu->int_sp[0] =
         local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 | local_2c << 0x18
    ;
    emu->int_sp[1] =
         local_28 >> 0x18 | (local_28 & 0xff0000) >> 8 | (local_28 & 0xff00) << 8 | local_28 << 0x18
    ;
    (*emu->sfrwrite)(emu,0x90);
    return;
  }
  return;
}

Assistant:

static void transfer_state(bool load, const char* path, struct em8051* emu) {
  transfer_data(load, path, "flash.bin", flash, sizeof(flash));
  transfer_data(load, path, "intmem.bin", emu->mLowerData, 0x100);
  transfer_data(load, path, "extmem.bin", emu->mExtData, 0x10000); // Mirror of MMIO
  transfer_data(load, path, "ram.bin", ram, sizeof(ram));
  transfer_data(load, path, "sfr.bin", emu->mSFR, 0x80);

  uint32_t cpu[] = {
    htonl(emu->mPC),
    htonl(emu->mTickDelay),
    htonl(emu->mInterruptActive),
    htonl(emu->int_a[0]), htonl(emu->int_a[1]),
    htonl(emu->int_psw[0]), htonl(emu->int_psw[1]),
    htonl(emu->int_sp[0]), htonl(emu->int_sp[1])
  };
  transfer_data(load, path, "cpu.bin", (uint8_t*)cpu, sizeof(cpu));
  if (load) {
    uint32_t* cursor = cpu;
    emu->mPC = ntohl(*cursor++);
    emu->mTickDelay = ntohl(*cursor++);
    emu->mInterruptActive = ntohl(*cursor++);
    emu->int_a[0] = ntohl(*cursor++); emu->int_a[1] = ntohl(*cursor++);
    emu->int_psw[0] = ntohl(*cursor++); emu->int_psw[1] = ntohl(*cursor++);
    emu->int_sp[0] = ntohl(*cursor++); emu->int_sp[1] = ntohl(*cursor++);
  }

  if (load) {

    // Trigger a bank switch
    emu->sfrwrite(emu, 0x80 + REG_P1);

  }
}